

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

FilterSample __thiscall pbrt::FilterSampler::Sample(FilterSampler *this,Point2f *u)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  Tuple2<pbrt::Point2,_float> TVar7;
  float *pfVar8;
  Tuple2<pbrt::Point2,_float> *p_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  FilterSample FVar15;
  Point2f p;
  Tuple2<pbrt::Point2,_float> local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar11._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u,(Float *)0x0);
  auVar11._8_56_ = extraout_var;
  p_00 = &local_18;
  local_18 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11._0_16_);
  auVar12._0_8_ = Bounds2<float>::Offset(&this->domain,(Point2<float> *)p_00);
  TVar7 = local_18;
  auVar12._8_56_ = extraout_var_00;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar14 = vpsubd_avx(auVar13,auVar14);
  auVar13 = vcvtdq2ps_avx(auVar14);
  auVar1._8_4_ = 0x3f000000;
  auVar1._0_8_ = 0x3f0000003f000000;
  auVar1._12_4_ = 0x3f000000;
  auVar10 = auVar12._0_16_;
  auVar9 = vfmadd213ps_avx512vl(auVar13,auVar10,auVar1);
  auVar13 = vpcmpeqd_avx(auVar10,auVar10);
  auVar13 = vpaddd_avx(auVar14,auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar2 = vcmpps_avx512vl(auVar13,auVar9,1);
  uVar3 = vcmpss_avx512f(auVar9,ZEXT816(0) << 0x40,1);
  auVar14 = vmovshdup_avx(auVar9);
  bVar6 = (byte)(uVar2 >> 1);
  auVar1 = vmovshdup_avx(auVar13);
  uVar4 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
  pfVar8 = Array2D<float>::operator[]
                     (&this->values,
                      (Point2i)(CONCAT44((int)((ulong)p_00 >> 0x20),
                                         (int)(float)((uint)!(bool)((byte)uVar3 & 1) *
                                                     ((uint)((byte)uVar2 & 1) * auVar13._0_4_ +
                                                     (uint)!(bool)((byte)uVar2 & 1) * auVar9._0_4_))
                                        ) |
                               (ulong)(uint)(int)(float)((uint)!(bool)((byte)uVar4 & 1) *
                                                        ((uint)(bVar6 & 1) * auVar1._0_4_ +
                                                        (uint)!(bool)(bVar6 & 1) * auVar14._0_4_))
                               << 0x20));
  uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)*pfVar8),0xe);
  bVar5 = (bool)((byte)uVar3 & 1);
  FVar15.weight = (Float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * 0x3f800000);
  FVar15.p.super_Tuple2<pbrt::Point2,_float> = TVar7;
  return FVar15;
}

Assistant:

Sample(const Point2f &u) const {
        Point2f p = distrib.Sample(u);
        Point2f p01 = Point2f(domain.Offset(p));
        Point2i pi(Clamp(p01.x * values.xSize() + 0.5f, 0, values.xSize() - 1),
                   Clamp(p01.y * values.ySize() + 0.5f, 0, values.ySize() - 1));
        return {p, values[pi] < 0 ? -1.f : 1.f};
    }